

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

ON_MappingChannel * __thiscall
ON_ObjectRenderingAttributes::MappingChannel
          (ON_ObjectRenderingAttributes *this,ON_UUID *plugin_id,int mapping_channel_id)

{
  ON_MappingRef *pOVar1;
  ON_MappingChannel *pOVar2;
  int iVar3;
  bool bVar4;
  
  pOVar1 = MappingRef(this,plugin_id);
  if ((pOVar1 != (ON_MappingRef *)0x0) && (iVar3 = (pOVar1->m_mapping_channels).m_count, 0 < iVar3))
  {
    pOVar2 = (pOVar1->m_mapping_channels).m_a;
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      if (pOVar2->m_mapping_channel_id == mapping_channel_id) {
        return pOVar2;
      }
      pOVar2 = pOVar2 + 1;
    }
  }
  return (ON_MappingChannel *)0x0;
}

Assistant:

const ON_MappingChannel* ON_ObjectRenderingAttributes::MappingChannel(
  const ON_UUID& plugin_id,
  int mapping_channel_id
  ) const
{
  const ON_MappingRef* mr = MappingRef(plugin_id);
  if ( mr )
  {
    int count;
    if ( (count = mr->m_mapping_channels.Count()) > 0 )
    {
      for ( const ON_MappingChannel* mc = mr->m_mapping_channels.Array(); count--; mc++ )
      {
        if ( mapping_channel_id == mc->m_mapping_channel_id )
          return mc;
      }
    }
  }
  return 0;
}